

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O3

void __thiscall cp::PlanFootprints::calcEndCP(PlanFootprints *this)

{
  long lVar1;
  double dVar2;
  
  lVar1 = (ulong)*(uint *)(this + 0x2e0) * 0xe0;
  *(double *)(this + 0x2d0) = *(double *)(this + lVar1 + 0x10) + *(double *)(this + 0x508);
  if (*(int *)(this + 0x308) - 3U < 2) {
    dVar2 = (*(double *)(this + 0x18) + *(double *)(this + 0xf8)) * 0.5;
  }
  else {
    if (*(uint *)(this + 0x2e0) != 0) {
      *(double *)(this + 0x2d8) = *(double *)(this + lVar1 + 0x18) - *(double *)(this + 0x510);
      return;
    }
    dVar2 = *(double *)(this + 0x510) + *(double *)(this + 0x18);
  }
  *(double *)(this + 0x2d8) = dVar2;
  return;
}

Assistant:

void PlanFootprints::calcEndCP() {
  if (wstate == stopping2 || wstate == stopping1) {
    end_cp[0] = ref_land_pose[swingleg].p().x() + end_cp_offset[0];
    end_cp[1] = (ref_land_pose[0].p().y() + ref_land_pose[1].p().y()) * 0.5;
  } else {
    end_cp[0] = ref_land_pose[swingleg].p().x() + end_cp_offset[0];
    if (swingleg == right) {
      end_cp[1] = ref_land_pose[swingleg].p().y() + end_cp_offset[1];
    } else {
      end_cp[1] = ref_land_pose[swingleg].p().y() - end_cp_offset[1];
    }
  }
}